

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_module_final(lyd_node *tree,lys_module *module,uint32_t val_opts)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  ly_ctx *local_58;
  ly_ht *local_50;
  ly_ht *getnext_ht;
  lys_module *plStack_40;
  uint32_t i;
  lys_module *mod;
  lyd_node *first;
  LY_ERR local_28;
  LY_ERR rc;
  LY_ERR r;
  uint32_t val_opts_local;
  lys_module *module_local;
  lyd_node *tree_local;
  
  first._4_4_ = LY_SUCCESS;
  getnext_ht._4_4_ = 0;
  local_50 = (ly_ht *)0x0;
  rc = val_opts;
  _r = module;
  module_local = (lys_module *)tree;
  if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module",
           "lyd_validate_module_final");
    tree_local._4_4_ = LY_EINVAL;
  }
  else if ((val_opts & 0x22) == 0) {
    if (tree != (lyd_node *)0x0) {
      if (tree->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)tree[2].schema;
      }
      else {
        plVar1 = tree->schema->module->ctx;
      }
      if ((plVar1 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
        if (tree == (lyd_node *)0x0) {
          local_60 = (ly_ctx *)0x0;
        }
        else {
          if (tree->schema == (lysc_node *)0x0) {
            local_58 = (ly_ctx *)tree[2].schema;
          }
          else {
            local_58 = tree->schema->module->ctx;
          }
          local_60 = local_58;
        }
        if (local_60 != module->ctx) {
          if (tree == (lyd_node *)0x0) {
            local_70 = (ly_ctx *)0x0;
          }
          else {
            if (tree->schema == (lysc_node *)0x0) {
              local_68 = (ly_ctx *)tree[2].schema;
            }
            else {
              local_68 = tree->schema->module->ctx;
            }
            local_70 = local_68;
          }
          ly_log(local_70,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    plStack_40 = lyd_mod_next_module(tree,module,module->ctx,(uint32_t *)((long)&getnext_ht + 4),
                                     (lyd_node **)&mod);
    if (plStack_40 == (lys_module *)0x0) {
      __assert_fail("mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                    ,0x876,
                    "LY_ERR lyd_validate_module_final(struct lyd_node *, const struct lys_module *, uint32_t)"
                   );
    }
    local_28 = lyd_val_getnext_ht_new(&local_50);
    LVar2 = local_28;
    if ((local_28 == LY_SUCCESS) &&
       (local_28 = lyd_validate_final_r
                             ((lyd_node *)mod,(lyd_node *)0x0,(lysc_node *)0x0,plStack_40,
                              (lysc_ext_instance *)0x0,rc,0,0,local_50), LVar2 = first._4_4_,
       local_28 != LY_SUCCESS)) {
      LVar2 = local_28;
    }
    first._4_4_ = LVar2;
    lyd_val_getnext_ht_free(local_50);
    tree_local._4_4_ = first._4_4_;
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "!(val_opts & (0x0002 | 0x0020))","lyd_validate_module_final");
    tree_local._4_4_ = LY_EINVAL;
  }
  return tree_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_validate_module_final(struct lyd_node *tree, const struct lys_module *module, uint32_t val_opts)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_node *first;
    const struct lys_module *mod;
    uint32_t i = 0;
    struct ly_ht *getnext_ht = NULL;

    LY_CHECK_ARG_RET(NULL, module, !(val_opts & (LYD_VALIDATE_PRESENT | LYD_VALIDATE_NOT_FINAL)), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(tree ? LYD_CTX(tree) : NULL, module->ctx, LY_EINVAL);

    /* module is unchanged but we need to get the first module data node */
    mod = lyd_mod_next_module(tree, module, module->ctx, &i, &first);
    assert(mod);

    /* create the getnext hash table for this module */
    r = lyd_val_getnext_ht_new(&getnext_ht);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

    /* perform final validation that assumes the data tree is final */
    r = lyd_validate_final_r(first, NULL, NULL, mod, NULL, val_opts, 0, 0, getnext_ht);
    LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

cleanup:
    lyd_val_getnext_ht_free(getnext_ht);
    return rc;
}